

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point_cloud_encoder.cc
# Opt level: O2

Status * __thiscall
draco::PointCloudEncoder::EncodeMetadata(Status *__return_storage_ptr__,PointCloudEncoder *this)

{
  GeometryMetadata *metadata;
  bool bVar1;
  MetadataEncoder metadata_encoder;
  allocator<char> local_32;
  MetadataEncoder local_31;
  string local_30 [32];
  
  metadata = (this->point_cloud_->metadata_)._M_t.
             super___uniq_ptr_impl<draco::GeometryMetadata,_std::default_delete<draco::GeometryMetadata>_>
             ._M_t.
             super__Tuple_impl<0UL,_draco::GeometryMetadata_*,_std::default_delete<draco::GeometryMetadata>_>
             .super__Head_base<0UL,_draco::GeometryMetadata_*,_false>._M_head_impl;
  if ((metadata != (GeometryMetadata *)0x0) &&
     (bVar1 = MetadataEncoder::EncodeGeometryMetadata(&local_31,this->buffer_,metadata), !bVar1)) {
    std::__cxx11::string::string<std::allocator<char>>
              (local_30,"Failed to encode metadata.",&local_32);
    __return_storage_ptr__->code_ = DRACO_ERROR;
    std::__cxx11::string::string((string *)&__return_storage_ptr__->error_msg_,local_30);
    std::__cxx11::string::~string(local_30);
    return __return_storage_ptr__;
  }
  __return_storage_ptr__->code_ = OK;
  (__return_storage_ptr__->error_msg_)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->error_msg_).field_2;
  (__return_storage_ptr__->error_msg_)._M_string_length = 0;
  (__return_storage_ptr__->error_msg_).field_2._M_local_buf[0] = '\0';
  return __return_storage_ptr__;
}

Assistant:

Status PointCloudEncoder::EncodeMetadata() {
  if (!point_cloud_->GetMetadata()) {
    return OkStatus();
  }
  MetadataEncoder metadata_encoder;
  if (!metadata_encoder.EncodeGeometryMetadata(buffer_,
                                               point_cloud_->GetMetadata())) {
    return Status(Status::DRACO_ERROR, "Failed to encode metadata.");
  }
  return OkStatus();
}